

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O0

void grasshopper_set_encrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  long in_RSI;
  grasshopper_w128_t *in_RDI;
  int k;
  int i;
  grasshopper_w128_t z;
  grasshopper_w128_t y;
  grasshopper_w128_t x;
  grasshopper_w128_t c;
  int in_stack_ffffffffffffffa8;
  int iVar1;
  uint uVar2;
  undefined8 in_stack_ffffffffffffffb0;
  grasshopper_w128_t local_40;
  grasshopper_w128_t local_30;
  grasshopper_w128_t local_20;
  grasshopper_w128_t *local_8;
  
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    local_30.b[iVar1] = *(uint8_t *)(in_RSI + iVar1);
    local_40.b[iVar1] = *(uint8_t *)(in_RSI + (iVar1 + 0x10));
  }
  local_8 = in_RDI;
  grasshopper_copy128(in_RDI,&local_30);
  grasshopper_copy128(local_8 + 1,&local_40);
  for (uVar2 = 1; (int)uVar2 < 0x21; uVar2 = uVar2 + 1) {
    grasshopper_zero128(&local_20);
    local_20.b[0xf] = (uint8_t)uVar2;
    grasshopper_l((grasshopper_w128_t *)in_stack_ffffffffffffffb0);
    grasshopper_plus128((grasshopper_w128_t *)in_stack_ffffffffffffffb0,
                        (grasshopper_w128_t *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),
                        (grasshopper_w128_t *)0x170260);
    grasshopper_convert128((grasshopper_w128_t *)&stack0xffffffffffffffb0,grasshopper_pi);
    grasshopper_l((grasshopper_w128_t *)in_stack_ffffffffffffffb0);
    grasshopper_append128((grasshopper_w128_t *)&stack0xffffffffffffffb0,&local_40);
    grasshopper_copy128(&local_40,&local_30);
    grasshopper_copy128(&local_30,(grasshopper_w128_t *)&stack0xffffffffffffffb0);
    if ((uVar2 & 7) == 0) {
      in_stack_ffffffffffffffa8 = (int)uVar2 >> 2;
      grasshopper_copy128(local_8 + in_stack_ffffffffffffffa8,&local_30);
      grasshopper_copy128(local_8 + (in_stack_ffffffffffffffa8 + 1),&local_40);
    }
  }
  grasshopper_zero128(&local_20);
  grasshopper_zero128(&local_30);
  grasshopper_zero128(&local_40);
  grasshopper_zero128((grasshopper_w128_t *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void grasshopper_set_encrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
    grasshopper_w128_t c, x, y, z;
    int i;

    for (i = 0; i < 16; i++) {
        // this will be have to changed for little-endian systems
        x.b[i] = key->k.b[i];
        y.b[i] = key->k.b[i + 16];
    }

    grasshopper_copy128(&subkeys->k[0], &x);
    grasshopper_copy128(&subkeys->k[1], &y);

    for (i = 1; i <= 32; i++) {

        // C Value
        grasshopper_zero128(&c);
        c.b[15] = (uint8_t) i;        // load round in lsb
        grasshopper_l(&c);

        grasshopper_plus128(&z, &x, &c);
        grasshopper_convert128(&z, grasshopper_pi);
        grasshopper_l(&z);
        grasshopper_append128(&z, &y);

        grasshopper_copy128(&y, &x);
        grasshopper_copy128(&x, &z);

        if ((i & 7) == 0) {
            int k = i >> 2;
            grasshopper_copy128(&subkeys->k[k], &x);
            grasshopper_copy128(&subkeys->k[k + 1], &y);
        }
    }

    // security++
    grasshopper_zero128(&c);
    grasshopper_zero128(&x);
    grasshopper_zero128(&y);
    grasshopper_zero128(&z);
}